

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O3

void __thiscall fineftp::FtpSession::handleFtpCommandDELE(FtpSession *this,string *param)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  FileType FVar3;
  int iVar4;
  string local_path;
  FileStatus file_status;
  string local_108;
  string local_e8;
  FileStatus local_c8;
  
  if ((this->logged_in_user_).super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    paVar1 = &local_c8.path_.field_2;
    local_c8.path_._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Not logged in","");
    sendFtpMessage(this,NOT_LOGGED_IN,&local_c8.path_);
    local_e8._M_dataplus._M_p = local_c8.path_._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.path_._M_dataplus._M_p == paVar1) {
      return;
    }
  }
  else {
    toLocalPath(&local_e8,this,param);
    Filesystem::FileStatus::FileStatus(&local_c8,(string *)&local_e8);
    bVar2 = Filesystem::FileStatus::isOk(&local_c8);
    if (bVar2) {
      FVar3 = Filesystem::FileStatus::type(&local_c8);
      if (FVar3 == RegularFile) {
        if ((((this->logged_in_user_).
              super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->permissions_
            & FileDelete) == None) {
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_108,"Permission denied","");
          sendFtpMessage(this,ACTION_NOT_TAKEN,&local_108);
        }
        else {
          iVar4 = unlink(local_e8._M_dataplus._M_p);
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          if (iVar4 == 0) {
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_108,"Successfully deleted file","");
            sendFtpMessage(this,FILE_ACTION_COMPLETED,&local_108);
          }
          else {
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_108,"Unable to delete file","");
            sendFtpMessage(this,FILE_ACTION_NOT_TAKEN,&local_108);
          }
        }
      }
      else {
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_108,"Resource is not a file","");
        sendFtpMessage(this,ACTION_NOT_TAKEN,&local_108);
      }
    }
    else {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,"Resource does not exist","");
      sendFtpMessage(this,ACTION_NOT_TAKEN,&local_108);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    Filesystem::FileStatus::~FileStatus(&local_c8);
    local_c8.path_.field_2._M_allocated_capacity = local_e8.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p == &local_e8.field_2) {
      return;
    }
  }
  operator_delete(local_e8._M_dataplus._M_p,local_c8.path_.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void FtpSession::handleFtpCommandDELE(const std::string& param)
  {
    if (!logged_in_user_)
    {
      sendFtpMessage(FtpReplyCode::NOT_LOGGED_IN,    "Not logged in");
      return;
    }
    std::string local_path = toLocalPath(param);

    auto file_status = Filesystem::FileStatus(local_path);

    if (!file_status.isOk())
    {
      sendFtpMessage(FtpReplyCode::ACTION_NOT_TAKEN, "Resource does not exist");
      return;
    }
    else if (file_status.type() != Filesystem::FileType::RegularFile)
    {
      sendFtpMessage(FtpReplyCode::ACTION_NOT_TAKEN, "Resource is not a file");
      return;
    }
    else
    {
      if (static_cast<int>(logged_in_user_->permissions_ & Permission::FileDelete) == 0)
      {
        sendFtpMessage(FtpReplyCode::ACTION_NOT_TAKEN, "Permission denied");
        return;
      }
      else
      {
#ifdef WIN32
        if (DeleteFileW(StrConvert::Utf8ToWide(local_path).c_str()) != 0)
        {
          sendFtpMessage(FtpReplyCode::FILE_ACTION_COMPLETED, "Successfully deleted file");
          return;
        }
        else
        {
          sendFtpMessage(FtpReplyCode::FILE_ACTION_NOT_TAKEN, "Unable to delete file: " + GetLastErrorStr());
          return;
        }
#else
        if (unlink(local_path.c_str()) == 0)
        {
          sendFtpMessage(FtpReplyCode::FILE_ACTION_COMPLETED, "Successfully deleted file");
          return;
        }
        else
        {
          sendFtpMessage(FtpReplyCode::FILE_ACTION_NOT_TAKEN, "Unable to delete file");
          return;
        }
#endif
      }
    }
  }